

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O1

int ncnn::conv3x3s1_winograd23_int8_xop(Mat *bottom_blob,Mat *top_blob,Mat *AT,int nT,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  Mat *pMVar11;
  long lVar12;
  long lVar13;
  void *pvVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  ulong *puVar18;
  int *piVar19;
  Option *pOVar20;
  int m_2;
  uint uVar21;
  int *piVar22;
  undefined1 (*pauVar23) [16];
  int iVar24;
  int iVar25;
  int m_3;
  uint uVar26;
  int iVar27;
  uint N;
  int *piVar28;
  Mat *pMVar29;
  int m_4;
  int iVar30;
  int iVar31;
  ulong uVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar39 [16];
  int TILE_N;
  int TILE_K;
  int TILE_M;
  Mat m;
  int tmp [2] [4] [4];
  Mat m_1;
  Allocator *_allocator;
  uint local_2dc;
  void *local_2d8;
  void *local_2d0;
  long local_2c8;
  uint local_2c0;
  int local_2bc;
  ulong *local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  Mat *local_2a0;
  ulong local_298;
  ulong local_290;
  Option *local_288;
  uint local_27c;
  Mat local_278;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  ulong local_210;
  void *local_208;
  void *local_200;
  Mat *local_1f8;
  int local_1f0;
  int local_1ec;
  Mat local_1e8;
  Mat local_168;
  Mat local_118;
  void *local_d0;
  void *local_c8;
  long local_c0;
  ulong local_b8;
  int local_ac;
  Mat *local_a8;
  long local_a0;
  void *local_98;
  ulong local_90;
  long local_88;
  long local_80;
  Mat local_78;
  
  auVar34 = in_ZMM1._0_16_;
  iVar9 = cpu_support_x86_avx_vnni();
  if (iVar9 != 0) {
    iVar9 = conv3x3s1_winograd23_int8_avxvnni(bottom_blob,top_blob,AT,nT,opt);
    return iVar9;
  }
  iVar9 = cpu_support_x86_avx2();
  if (iVar9 != 0) {
    iVar9 = conv3x3s1_winograd23_int8_avx2(bottom_blob,top_blob,AT,nT,opt);
    return iVar9;
  }
  uVar1 = top_blob->w;
  uVar2 = top_blob->h;
  auVar35._4_4_ = uVar2;
  auVar35._0_4_ = uVar1;
  auVar34 = vpcmpeqd_avx(auVar34,auVar34);
  auVar35._8_8_ = 0;
  auVar34 = vpsubd_avx(auVar35,auVar34);
  auVar35 = vpsrld_avx(auVar34,0x1f);
  auVar34 = vpaddd_avx(auVar34,auVar35);
  auVar34 = vpsrad_avx(auVar34,1);
  uVar21 = top_blob->elempack * top_blob->c;
  N = auVar34._4_4_ * auVar34._0_4_;
  uVar26 = bottom_blob->elempack * bottom_blob->c;
  local_2a8 = CONCAT44(local_2a8._4_4_,nT);
  local_2a0 = bottom_blob;
  local_288 = opt;
  get_optimal_tile_mnk_int8(uVar21,N,uVar26,(int *)&local_27c,(int *)&local_2dc,&local_2bc,nT);
  pOVar20 = local_288;
  local_1f0 = (int)(local_27c + uVar21 + -1) / (int)local_27c;
  iVar24 = (int)(local_2dc + N + -1) / (int)local_2dc;
  iVar9 = (int)(uVar26 + local_2bc + -1) / local_2bc;
  iVar30 = local_2bc * local_2dc;
  _allocator = local_288->workspace_allocator;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  local_2c8 = CONCAT44(local_2c8._4_4_,iVar9);
  local_228 = (ulong)N;
  local_220 = (ulong)uVar26;
  local_90 = (ulong)uVar21;
  Mat::create(&local_118,iVar30,0x10,iVar9,iVar24,2,_allocator);
  iVar9 = -100;
  if ((local_118.data == (void *)0x0) || ((long)local_118.c * local_118.cstep == 0))
  goto LAB_00273ab7;
  iVar9 = (int)local_2c8;
  iVar24 = iVar24 * (int)local_2c8;
  iVar30 = iVar30 * 0x10;
  local_1f8 = top_blob;
  if (((int)local_2a8 < 2) || ((int)local_2a8 <= iVar24)) {
    local_1e8.cstep = 0;
    local_1e8.data = (void *)0x0;
    local_1e8.refcount._0_4_ = 0;
    local_1e8.refcount._4_4_ = 0;
    local_1e8.elemsize._0_4_ = 0;
    local_1e8.elemsize._4_4_ = 0;
    local_1e8.elempack = 0;
    local_1e8.allocator = (Allocator *)0x0;
    local_1e8.dims = 0;
    local_1e8.w = 0;
    local_1e8.h = 0;
    local_1e8.d = 0;
    local_1e8.c = 0;
    Mat::create(&local_1e8,iVar30,1,(int)local_2a8,2,pOVar20->workspace_allocator);
    bVar33 = (long)local_1e8.c * local_1e8.cstep == 0;
    if (local_1e8.data != (void *)0x0 && !bVar33) {
      local_2d8 = (void *)CONCAT71(local_2d8._1_7_,local_1e8.data == (void *)0x0 || bVar33);
      uVar32 = local_228;
      local_a8 = AT;
      if (0 < iVar24) {
        iVar30 = 0;
        do {
          iVar27 = local_2dc * (iVar30 / iVar9);
          local_2d0 = (void *)CONCAT44(local_2d0._4_4_,iVar30 % iVar9);
          iVar15 = local_2bc * (iVar30 % iVar9);
          uVar21 = (int)uVar32 - iVar27;
          if ((int)local_2dc < (int)uVar21) {
            uVar21 = local_2dc;
          }
          iVar25 = (int)local_220 - iVar15;
          if (local_2bc < iVar25) {
            iVar25 = local_2bc;
          }
          iVar31 = get_omp_thread_num();
          local_2b8 = (ulong *)CONCAT44(local_2b8._4_4_,iVar30);
          local_278.elemsize = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
          local_278.data =
               (void *)((long)iVar31 * local_1e8.cstep * local_278.elemsize + (long)local_1e8.data);
          local_278.refcount._0_4_ = 0;
          local_278.refcount._4_4_ = 0;
          local_278.elempack = local_1e8.elempack;
          local_278.allocator = local_1e8.allocator;
          local_278.w = local_1e8.w;
          local_278.h = local_1e8.h;
          local_278.d = 1;
          local_278.c = local_1e8.d;
          local_278.dims = local_1e8.dims + -1;
          local_278.cstep =
               (local_278.elemsize * (long)local_1e8.h * (long)local_1e8.w + 0xf &
               0xfffffffffffffff0) / local_278.elemsize;
          if (local_1e8.dims == 4) {
            local_278.cstep = (long)local_1e8.h * (long)local_1e8.w;
          }
          conv3x3s1_winograd23_transform_input_tile_int8
                    (local_2a0,&local_278,iVar27,uVar21,iVar15,iVar25,(int)_allocator);
          local_168.cstep = (long)local_118.h * (long)local_118.w;
          local_168.data =
               (void *)((long)local_118.data +
                       ((ulong)local_2d0 & 0xffffffff) * local_118.elemsize * local_168.cstep +
                       (long)(iVar30 / iVar9) * local_118.cstep * local_118.elemsize);
          local_168.refcount._0_4_ = 0;
          local_168.refcount._4_4_ = 0;
          local_168.elemsize._0_4_ = (undefined4)local_118.elemsize;
          local_168.elemsize._4_4_ = (undefined4)(local_118.elemsize >> 0x20);
          local_168.elempack = local_118.elempack;
          local_168.allocator = local_118.allocator;
          local_168.dims = 2;
          local_168.w = local_118.w;
          local_168.h = local_118.h;
          local_168.d = 1;
          local_168.c = 1;
          transpose_pack_B_tile_int8(&local_278,&local_168,0x10,uVar21,iVar25,(int)local_168.cstep);
          uVar32 = local_228;
          local_168.cstep = 0;
          local_168.data = (void *)0x0;
          local_168.refcount._0_4_ = 0;
          local_168.refcount._4_4_ = 0;
          local_168.elemsize._0_4_ = 0;
          local_168.elemsize._4_4_ = 0;
          local_168.elempack = 0;
          local_168.dims = 0;
          local_168.w = 0;
          local_168.h = 0;
          local_168.d = 0;
          local_168.c = 0;
          piVar22 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
          iVar30 = (int)local_2b8;
          if (piVar22 != (int *)0x0) {
            LOCK();
            *piVar22 = *piVar22 + -1;
            UNLOCK();
            if (*piVar22 == 0) {
              if (local_278.allocator == (Allocator *)0x0) {
                if (local_278.data != (void *)0x0) {
                  free(local_278.data);
                }
              }
              else {
                (*(local_278.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_278.cstep = 0;
          local_278.data = (void *)0x0;
          local_278.refcount._0_4_ = 0;
          local_278.refcount._4_4_ = 0;
          local_278.elemsize = 0;
          local_278.elempack = 0;
          local_278.dims = 0;
          local_278.w = 0;
          local_278.h = 0;
          local_278.d = 0;
          local_278.c = 0;
          iVar30 = iVar30 + 1;
          iVar9 = (int)local_2c8;
        } while (iVar24 != iVar30);
      }
      pOVar20 = local_288;
      piVar22 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + -1;
        UNLOCK();
        if (*piVar22 == 0) {
          if (local_1e8.allocator == (Allocator *)0x0) {
            if (local_1e8.data != (void *)0x0) {
              free(local_1e8.data);
            }
          }
          else {
            (*(local_1e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_00272dad;
    }
    piVar22 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + -1;
      UNLOCK();
      if (*piVar22 == 0) {
        if (local_1e8.allocator == (Allocator *)0x0) goto LAB_00272cdd;
        (*(local_1e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    local_1e8.cstep = 0;
    local_1e8.data = (void *)0x0;
    local_1e8.refcount._0_4_ = 0;
    local_1e8.refcount._4_4_ = 0;
    local_1e8.elemsize._0_4_ = 0;
    local_1e8.elemsize._4_4_ = 0;
    local_1e8.elempack = 0;
    local_1e8.allocator = (Allocator *)0x0;
    local_1e8.dims = 0;
    local_1e8.w = 0;
    local_1e8.h = 0;
    local_1e8.d = 0;
    local_1e8.c = 0;
    Mat::create(&local_1e8,iVar30,2,pOVar20->workspace_allocator);
    pMVar29 = local_2a0;
    bVar33 = (long)local_1e8.c * local_1e8.cstep == 0;
    if (local_1e8.data != (void *)0x0 && !bVar33) {
      local_2d8 = (void *)CONCAT71(local_2d8._1_7_,local_1e8.data == (void *)0x0 || bVar33);
      uVar32 = local_228;
      local_a8 = AT;
      if (0 < iVar24) {
        local_2d0 = (void *)CONCAT44(local_2d0._4_4_,local_2dc);
        local_2b8 = (ulong *)CONCAT44(local_2b8._4_4_,local_2bc);
        iVar30 = 0;
        do {
          iVar15 = (int)local_2d0 * (iVar30 / iVar9);
          iVar25 = (int)local_2b8 * (int)((long)iVar30 % (long)iVar9);
          iVar27 = (int)uVar32 - iVar15;
          if ((int)local_2d0 < iVar27) {
            iVar27 = (int)local_2d0;
          }
          iVar31 = (int)local_220 - iVar25;
          if ((int)local_2b8 < iVar31) {
            iVar31 = (int)local_2b8;
          }
          conv3x3s1_winograd23_transform_input_tile_int8
                    (pMVar29,&local_1e8,iVar15,iVar27,iVar25,iVar31,(int)_allocator);
          uVar32 = local_228;
          local_278.cstep = (long)local_118.h * (long)local_118.w;
          local_278.data =
               (void *)((long)local_118.data +
                       ((long)iVar30 % (long)iVar9 & 0xffffffffU) * local_118.elemsize *
                       local_278.cstep +
                       (long)(iVar30 / iVar9) * local_118.cstep * local_118.elemsize);
          iVar9 = (int)local_2c8;
          local_278.refcount._0_4_ = 0;
          local_278.refcount._4_4_ = 0;
          local_278.elemsize = local_118.elemsize;
          local_278.elempack = local_118.elempack;
          local_278.allocator = local_118.allocator;
          local_278.dims = 2;
          local_278.w = local_118.w;
          local_278.h = local_118.h;
          local_278.d = 1;
          local_278.c = 1;
          transpose_pack_B_tile_int8(&local_1e8,&local_278,0x10,iVar27,iVar31,(int)local_278.cstep);
          local_278.cstep = 0;
          local_278.data = (void *)0x0;
          local_278.refcount._0_4_ = 0;
          local_278.refcount._4_4_ = 0;
          local_278.elemsize = 0;
          local_278.elempack = 0;
          local_278.dims = 0;
          local_278.w = 0;
          local_278.h = 0;
          local_278.d = 0;
          local_278.c = 0;
          iVar30 = iVar30 + 1;
        } while (iVar24 != iVar30);
      }
      pOVar20 = local_288;
      piVar22 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + -1;
        UNLOCK();
        if (*piVar22 == 0) {
          if (local_1e8.allocator == (Allocator *)0x0) {
            if (local_1e8.data != (void *)0x0) {
              free(local_1e8.data);
            }
          }
          else {
            (*(local_1e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
LAB_00272dad:
      local_1e8.cstep = 0;
      local_1e8.c = 0;
      local_1e8.d = 0;
      local_1e8.h = 0;
      local_1e8.w = 0;
      local_1e8.dims = 0;
      local_1e8.elempack = 0;
      local_1e8.elemsize._4_4_ = 0;
      local_1e8.elemsize._0_4_ = 0;
      local_1e8.refcount._4_4_ = 0;
      local_1e8.refcount._0_4_ = 0;
      local_1e8.data = (void *)0x0;
      iVar9 = -100;
      if ((char)local_2d8 == '\0') {
        local_278.cstep = 0;
        local_278.data = (void *)0x0;
        local_278.refcount._0_4_ = 0;
        local_278.refcount._4_4_ = 0;
        local_278.elemsize = 0;
        local_278.elempack = 0;
        local_278.allocator = (Allocator *)0x0;
        local_278.dims = 0;
        local_278.w = 0;
        local_278.h = 0;
        local_278.d = 0;
        local_278.c = 0;
        Mat::create(&local_278,local_2dc * local_27c * 0x10,1,(int)local_2a8,4,
                    pOVar20->workspace_allocator);
        iVar9 = -100;
        if ((local_278.data != (void *)0x0) && ((long)local_278.c * local_278.cstep != 0)) {
          if (local_1f0 < 1) {
            iVar9 = 0;
          }
          else {
            iVar9 = 0;
            pMVar29 = local_1f8;
            do {
              uVar21 = local_27c;
              iVar24 = get_omp_thread_num();
              local_168.data =
                   (void *)((long)iVar24 * local_278.cstep * local_278.elemsize +
                           (long)local_278.data);
              local_168.refcount._0_4_ = 0;
              local_168.refcount._4_4_ = 0;
              local_168.elemsize._0_4_ = (undefined4)local_278.elemsize;
              local_168.elemsize._4_4_ = (undefined4)(local_278.elemsize >> 0x20);
              local_168.elempack = local_278.elempack;
              local_168.allocator = local_278.allocator;
              local_168.w = local_278.w;
              local_168.h = local_278.h;
              local_168.d = 1;
              local_168.c = local_278.d;
              local_168.cstep =
                   (local_278.elemsize * (long)local_278.h * (long)local_278.w + 0xf &
                   0xfffffffffffffff0) / local_278.elemsize;
              local_168.dims = local_278.dims + -1;
              if (local_278.dims == 4) {
                local_168.cstep = (long)local_278.h * (long)local_278.w;
              }
              local_ac = iVar9;
              uVar26 = uVar21 * iVar9;
              local_b8 = (ulong)uVar26;
              local_2c0 = (int)local_90 - uVar26;
              if ((int)uVar21 < (int)local_2c0) {
                local_2c0 = uVar21;
              }
              if (0 < (int)uVar32) {
                local_98 = (void *)(ulong)local_2c0;
                local_80 = (long)(int)local_2c0;
                local_a0 = (long)(int)uVar26;
                pMVar11 = (Mat *)0x0;
                do {
                  uVar21 = (int)uVar32 - (int)pMVar11;
                  if ((int)local_2dc < (int)uVar21) {
                    uVar21 = local_2dc;
                  }
                  local_2b0 = (ulong)uVar21;
                  local_2a0 = pMVar11;
                  if (0 < (int)local_220) {
                    iVar9 = 0;
                    uVar32 = local_220;
                    do {
                      uVar8 = local_220;
                      iVar24 = (int)uVar32 - iVar9;
                      if (local_2bc < iVar24) {
                        iVar24 = local_2bc;
                      }
                      local_1e8.w = local_a8->w;
                      sVar7 = local_a8->elemsize;
                      local_1e8.h = local_a8->h;
                      local_1e8.elempack = local_a8->elempack;
                      local_1e8.allocator = local_a8->allocator;
                      local_1e8.cstep = (long)local_1e8.h * (long)local_1e8.w;
                      local_1e8.data =
                           (void *)((long)local_a8->data +
                                   sVar7 * local_1e8.cstep * (long)(iVar9 / local_2bc) +
                                   (long)(int)((long)((ulong)(uint)((int)local_b8 >> 0x1f) << 0x20 |
                                                     local_b8 & 0xffffffff) / (long)(int)local_27c)
                                   * local_a8->cstep * sVar7);
                      local_1e8.refcount._0_4_ = 0;
                      local_1e8.refcount._4_4_ = 0;
                      local_1e8.elemsize._0_4_ = (undefined4)sVar7;
                      local_1e8.elemsize._4_4_ = (undefined4)(sVar7 >> 0x20);
                      local_1e8.dims = 2;
                      local_1e8.d = 1;
                      local_1e8.c = 1;
                      local_78.cstep = (long)local_118.h * (long)local_118.w;
                      local_78.data =
                           (void *)((long)local_118.data +
                                   local_78.cstep * local_118.elemsize * (long)(iVar9 / local_2bc) +
                                   (long)(int)((long)((ulong)(uint)((int)local_2a0 >> 0x1f) << 0x20
                                                     | (ulong)local_2a0 & 0xffffffff) /
                                              (long)(int)local_2dc) * local_118.cstep *
                                   local_118.elemsize);
                      local_78.refcount._0_4_ = 0;
                      local_78.refcount._4_4_ = 0;
                      local_78.elemsize._0_4_ = (undefined4)local_118.elemsize;
                      local_78.elemsize._4_4_ = (undefined4)(local_118.elemsize >> 0x20);
                      local_78.elempack = local_118.elempack;
                      local_78.allocator = local_118.allocator;
                      local_78.w = local_118.w;
                      local_78.dims = 2;
                      local_78.h = local_118.h;
                      local_78.d = 1;
                      local_78.c = 1;
                      iVar30 = (int)local_220;
                      gemm_transB_packed_tile_int8
                                (&local_1e8,&local_78,&local_168,0x10,local_2c0,(int)local_2b0,iVar9
                                 ,iVar24,iVar30 <= local_2bc + iVar9);
                      local_78.cstep = 0;
                      local_78.data = (void *)0x0;
                      local_78.refcount._0_4_ = 0;
                      local_78.refcount._4_4_ = 0;
                      local_78.elemsize._0_4_ = 0;
                      local_78.elemsize._4_4_ = 0;
                      local_78.elempack = 0;
                      local_78.dims = 0;
                      local_78.w = 0;
                      local_78.h = 0;
                      local_78.d = 0;
                      local_78.c = 0;
                      piVar22 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
                      if (piVar22 != (int *)0x0) {
                        LOCK();
                        *piVar22 = *piVar22 + -1;
                        UNLOCK();
                        if (*piVar22 == 0) {
                          if (local_1e8.allocator == (Allocator *)0x0) {
                            if (local_1e8.data != (void *)0x0) {
                              free(local_1e8.data);
                            }
                          }
                          else {
                            (*(local_1e8.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      local_1e8.cstep = 0;
                      local_1e8.data = (void *)0x0;
                      local_1e8.refcount._0_4_ = 0;
                      local_1e8.refcount._4_4_ = 0;
                      local_1e8.elemsize._0_4_ = 0;
                      local_1e8.elemsize._4_4_ = 0;
                      local_1e8.elempack = 0;
                      local_1e8.dims = 0;
                      local_1e8.w = 0;
                      local_1e8.h = 0;
                      local_1e8.d = 0;
                      local_1e8.c = 0;
                      iVar9 = iVar9 + local_2bc;
                      uVar32 = uVar8;
                    } while (iVar9 < iVar30);
                  }
                  iVar9 = pMVar29->w;
                  local_2c8 = (long)iVar9;
                  iVar24 = pMVar29->elempack;
                  iVar30 = pMVar29->h;
                  iVar31 = (int)pMVar29->cstep * iVar24;
                  iVar27 = (iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1;
                  local_288 = (Option *)CONCAT44(local_288._4_4_,iVar27);
                  iVar15 = (int)local_2b0;
                  local_1ec = iVar15 * 0x10;
                  uVar32 = 0;
                  iVar25 = (int)local_2a0;
                  if (3 < (int)local_2c0) {
                    local_d0 = (void *)CONCAT44(local_d0._4_4_,iVar31);
                    local_2d0 = (void *)(long)iVar31;
                    local_2b8 = (ulong *)(long)(iVar31 * 2);
                    local_208 = (void *)(local_2b0 & 0xffffffff);
                    local_298 = CONCAT44(local_298._4_4_,iVar15 * 0x40);
                    local_218 = (long)(iVar15 * 4) * 4;
                    local_c0 = (long)(iVar15 * 8) * 4;
                    local_c8 = (void *)((long)(iVar15 * 0xc) * 4);
                    local_290 = 0;
                    local_210 = 0;
                    do {
                      if (0 < iVar15) {
                        lVar12 = (long)(int)local_290;
                        local_200 = (void *)(long)(((int)local_b8 + (int)local_210) / iVar24);
                        uVar32 = 0;
                        pvVar14 = (void *)0x0;
                        do {
                          local_2d8 = pvVar14;
                          local_2a8 = uVar32;
                          lVar13 = (long)local_168.data + local_2a8;
                          lVar17 = -0x40;
                          do {
                            auVar34 = *(undefined1 (*) [16])(lVar13 + local_218 + lVar12 * 4);
                            auVar35 = *(undefined1 (*) [16])(lVar13 + local_c0 + lVar12 * 4);
                            auVar36 = vpaddd_avx(auVar34,*(undefined1 (*) [16])(lVar13 + lVar12 * 4)
                                                );
                            auVar36 = vpaddd_avx(auVar36,auVar35);
                            auVar34 = vpsubd_avx(auVar34,auVar35);
                            auVar34 = vpaddd_avx(auVar34,*(undefined1 (*) [16])
                                                          ((long)local_c8 + lVar13 + lVar12 * 4));
                            *(undefined1 (*) [16])((long)&local_1e8.cstep + lVar17) = auVar36;
                            *(undefined1 (*) [16])((long)&local_168.data + lVar17) = auVar34;
                            lVar13 = lVar13 + (long)local_1ec * 4;
                            lVar17 = lVar17 + 0x10;
                          } while (lVar17 != 0);
                          iVar10 = iVar25 + (int)local_2d8;
                          iVar16 = iVar10 % iVar27;
                          uVar21 = (iVar10 / iVar27) * 2;
                          pauVar23 = (undefined1 (*) [16])
                                     ((long)local_1f8->data +
                                     (long)(iVar16 * 2 * iVar24) * 4 +
                                     (long)local_1f8->w * local_1f8->elemsize * (long)(int)uVar21 +
                                     local_1f8->cstep * (long)local_200 * local_1f8->elemsize);
                          iVar16 = iVar16 * 2 + 1;
                          piVar22 = &local_1e8.h;
                          lVar13 = 0;
                          do {
                            if ((int)(uVar21 | (uint)lVar13) < iVar30) {
                              auVar34._0_8_ = ((Mat *)(piVar22 + -0xc))->data;
                              auVar34._8_8_ = ((Mat *)(piVar22 + -0xc))->refcount;
                              auVar34 = vpaddd_avx(*(undefined1 (*) [16])(piVar22 + -8),auVar34);
                              auVar35 = vpsubd_avx(*(undefined1 (*) [16])(piVar22 + -8),
                                                   *(undefined1 (*) [16])(piVar22 + -4));
                              auVar35 = vpaddd_avx(auVar35,*(undefined1 (*) [16])piVar22);
                              auVar34 = vpaddd_avx(auVar34,*(undefined1 (*) [16])(piVar22 + -4));
                              auVar36 = vpsrad_avx(auVar34,2);
                              auVar34 = vpsrad_avx(auVar35,2);
                              if (iVar24 == 1) {
                                *(int *)*pauVar23 = auVar36._0_4_;
                                *(int *)(*pauVar23 + (long)local_2d0 * 4) = auVar36._4_4_;
                                *(int *)(*pauVar23 + (long)local_2b8 * 4) = auVar36._8_4_;
                                *(int *)(*pauVar23 + (long)(iVar31 * 3) * 4) = auVar36._12_4_;
                                if (iVar16 < iVar9) {
                                  *(int *)(*pauVar23 + 4) = auVar34._0_4_;
                                  *(int *)(*pauVar23 + (long)local_2d0 * 4 + 4) = auVar34._4_4_;
                                  *(int *)(*pauVar23 + (long)local_2b8 * 4 + 4) = auVar34._8_4_;
                                  *(int *)(*pauVar23 + (long)(iVar31 * 3) * 4 + 4) = auVar34._12_4_;
                                }
                              }
                              else if ((iVar24 == 4) && (*pauVar23 = auVar36, iVar16 < iVar9)) {
                                pauVar23[1] = auVar34;
                              }
                              pauVar23 = (undefined1 (*) [16])
                                         (*pauVar23 + (long)(iVar24 * iVar9) * 4);
                            }
                            lVar13 = lVar13 + 1;
                            piVar22 = piVar22 + 0x10;
                          } while (lVar13 == 1);
                          uVar32 = local_2a8 + 0x10;
                          pvVar14 = (void *)((long)local_2d8 + 1U);
                        } while ((void *)((long)local_2d8 + 1U) != local_208);
                      }
                      uVar32 = local_210 + 4;
                      pvVar14 = (void *)(local_210 + 7);
                      local_290 = (ulong)(uint)((int)local_290 + iVar15 * 0x40);
                      pMVar29 = local_1f8;
                      local_210 = uVar32;
                    } while (pvVar14 < local_98);
                  }
                  if ((int)((uint)uVar32 | 1) < (int)local_2c0) {
                    local_c8 = local_168.data;
                    local_200 = (void *)(long)(iVar15 * 2);
                    local_208 = (void *)(long)(iVar15 * 4);
                    local_d0 = pMVar29->data;
                    local_290 = pMVar29->elemsize;
                    local_88 = pMVar29->cstep * local_290;
                    local_2d0 = (void *)(long)iVar31;
                    local_210 = local_2b0 & 0xffffffff;
                    uVar21 = (uint)uVar32 * iVar15 * 0x10;
                    local_c0 = CONCAT44(local_c0._4_4_,iVar15 * 0x20);
                    local_218 = uVar32 & 0xffffffff;
                    do {
                      local_298 = (ulong)uVar21;
                      if (0 < iVar15) {
                        local_2d8 = (void *)((local_a0 + local_218) * local_88 + (long)local_d0);
                        uVar32 = 0;
                        puVar18 = (ulong *)((long)local_168.data + (long)(int)uVar21 * 4);
                        do {
                          local_2b8 = puVar18;
                          local_2a8 = uVar32;
                          lVar12 = -0x20;
                          puVar18 = local_2b8;
                          do {
                            auVar36._8_8_ = 0;
                            auVar36._0_8_ = *puVar18;
                            auVar37._8_8_ = 0;
                            auVar37._0_8_ = *(ulong *)((long)puVar18 + (long)local_200 * 4);
                            auVar34 = vpaddd_avx(auVar37,auVar36);
                            auVar39._8_8_ = 0;
                            auVar39._0_8_ = *(ulong *)((long)puVar18 + (long)local_208 * 4);
                            auVar34 = vpaddd_avx(auVar34,auVar39);
                            *(long *)((long)&local_1e8.allocator + lVar12) = auVar34._0_8_;
                            auVar34 = vpsubd_avx(auVar37,auVar39);
                            auVar38._8_8_ = 0;
                            auVar38._0_8_ = *(ulong *)((long)puVar18 + (long)(iVar15 * 6) * 4);
                            auVar34 = vpaddd_avx(auVar34,auVar38);
                            *(long *)((long)&local_1e8.cstep + lVar12) = auVar34._0_8_;
                            puVar18 = (ulong *)((long)puVar18 + (long)(iVar15 * 8) * 4);
                            lVar12 = lVar12 + 8;
                          } while (lVar12 != 0);
                          iVar31 = iVar25 + (int)local_2a8;
                          iVar24 = iVar31 % iVar27;
                          uVar26 = (iVar31 / iVar27) * 2;
                          piVar22 = (int *)((long)local_2d8 +
                                           (long)(iVar24 * 2) * 4 +
                                           (long)pMVar29->w * local_290 * (long)(int)uVar26);
                          piVar19 = (int *)&local_1e8.field_0x1c;
                          lVar12 = 0;
                          do {
                            if ((int)(uVar26 | (uint)lVar12) < iVar30) {
                              iVar31 = piVar19[-5];
                              iVar16 = piVar19[-4];
                              iVar10 = piVar19[-3];
                              iVar3 = piVar19[-6];
                              iVar4 = piVar19[-2];
                              iVar5 = piVar19[-1];
                              iVar6 = *piVar19;
                              *piVar22 = piVar19[-7] + iVar31 + iVar10 >> 2;
                              piVar22[(long)local_2d0] = iVar3 + iVar16 + iVar4 >> 2;
                              if (iVar24 * 2 + 1 < iVar9) {
                                piVar22[1] = (iVar31 - iVar10) + iVar5 >> 2;
                                piVar22[(long)local_2d0 + 1] = (iVar16 - iVar4) + iVar6 >> 2;
                              }
                              piVar22 = piVar22 + local_2c8;
                            }
                            lVar12 = lVar12 + 1;
                            piVar19 = piVar19 + 8;
                          } while (lVar12 == 1);
                          uVar32 = local_2a8 + 1;
                          puVar18 = local_2b8 + 1;
                          pMVar29 = local_1f8;
                        } while (local_2a8 + 1 != local_210);
                      }
                      uVar32 = local_218 + 2;
                      lVar12 = local_218 + 3;
                      uVar21 = uVar21 + iVar15 * 0x20;
                      local_218 = uVar32;
                    } while (lVar12 < local_80);
                    uVar32 = uVar32 & 0xffffffff;
                  }
                  if ((int)uVar32 < (int)local_2c0) {
                    local_200 = local_168.data;
                    local_208 = pMVar29->data;
                    local_2b8 = (ulong *)pMVar29->elemsize;
                    local_290 = pMVar29->cstep * (long)local_2b8;
                    local_2d8 = (void *)(uVar32 & 0xffffffff);
                    local_2a8 = local_2b0 & 0xffffffff;
                    uVar21 = (int)uVar32 * iVar15 * 0x10;
                    do {
                      local_298 = (ulong)uVar21;
                      if (0 < iVar15) {
                        piVar22 = (int *)((long)local_168.data + (long)(int)uVar21 * 4);
                        local_2d0 = (void *)((local_a0 + (long)local_2d8) * local_290 +
                                            (long)local_208);
                        uVar32 = 0;
                        do {
                          lVar12 = -0x10;
                          piVar19 = piVar22;
                          do {
                            iVar24 = piVar19[iVar15];
                            iVar31 = piVar19[iVar15 * 2];
                            *(int *)((long)&local_1e8.elemsize + lVar12) =
                                 *piVar19 + iVar24 + iVar31;
                            *(int *)((long)&local_1e8.allocator + lVar12) =
                                 (iVar24 - iVar31) + piVar19[iVar15 * 3];
                            piVar19 = piVar19 + iVar15 * 4;
                            lVar12 = lVar12 + 4;
                          } while (lVar12 != 0);
                          iVar31 = iVar25 + (int)uVar32;
                          iVar24 = iVar31 % iVar27;
                          uVar26 = (iVar31 / iVar27) * 2;
                          piVar19 = (int *)((long)local_2d0 +
                                           (long)(iVar24 * 2) * 4 +
                                           (long)pMVar29->w * (long)local_2b8 * (long)(int)uVar26);
                          piVar28 = (int *)((long)&local_1e8.refcount + 4);
                          lVar12 = 0;
                          do {
                            if ((int)(uVar26 | (uint)lVar12) < iVar30) {
                              iVar31 = piVar28[-2];
                              iVar16 = piVar28[-1];
                              iVar10 = *piVar28;
                              *piVar19 = piVar28[-3] + iVar31 + iVar16 >> 2;
                              if (iVar24 * 2 + 1 < iVar9) {
                                piVar19[1] = (iVar31 - iVar16) + iVar10 >> 2;
                              }
                              piVar19 = piVar19 + local_2c8;
                            }
                            lVar12 = lVar12 + 1;
                            piVar28 = piVar28 + 4;
                          } while (lVar12 == 1);
                          uVar32 = uVar32 + 1;
                          piVar22 = piVar22 + 1;
                          pMVar29 = local_1f8;
                        } while (uVar32 != local_2a8);
                      }
                      local_2d8 = (void *)((long)local_2d8 + 1);
                      uVar21 = uVar21 + local_1ec;
                    } while (local_2d8 != local_98);
                  }
                  pMVar11 = (Mat *)(ulong)(iVar25 + local_2dc);
                  uVar32 = local_228;
                } while ((int)(iVar25 + local_2dc) < (int)local_228);
              }
              iVar9 = local_ac;
              piVar22 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
              if (piVar22 != (int *)0x0) {
                LOCK();
                *piVar22 = *piVar22 + -1;
                UNLOCK();
                if (*piVar22 == 0) {
                  if (local_168.allocator == (Allocator *)0x0) {
                    if (local_168.data != (void *)0x0) {
                      free(local_168.data);
                    }
                  }
                  else {
                    (*(local_168.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_168.cstep = 0;
              local_168.data = (void *)0x0;
              local_168.refcount._0_4_ = 0;
              local_168.refcount._4_4_ = 0;
              local_168.elemsize._0_4_ = 0;
              local_168.elemsize._4_4_ = 0;
              local_168.elempack = 0;
              local_168.dims = 0;
              local_168.w = 0;
              local_168.h = 0;
              local_168.d = 0;
              local_168.c = 0;
              iVar9 = iVar9 + 1;
            } while (iVar9 != local_1f0);
            iVar9 = 0;
          }
        }
        piVar22 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
        if (piVar22 != (int *)0x0) {
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 == 0) {
            if (local_278.allocator == (Allocator *)0x0) {
              if (local_278.data != (void *)0x0) {
                free(local_278.data);
              }
            }
            else {
              (*(local_278.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_278.cstep = 0;
        local_278.data = (void *)0x0;
        local_278.refcount._0_4_ = 0;
        local_278.refcount._4_4_ = 0;
        local_278.elemsize = 0;
        local_278.elempack = 0;
        local_278.dims = 0;
        local_278.w = 0;
        local_278.h = 0;
        local_278.d = 0;
        local_278.c = 0;
      }
      goto LAB_00273ab7;
    }
    piVar22 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + -1;
      UNLOCK();
      if (*piVar22 == 0) {
        if (local_1e8.allocator == (Allocator *)0x0) {
LAB_00272cdd:
          if (local_1e8.data != (void *)0x0) {
            free(local_1e8.data);
          }
        }
        else {
          (*(local_1e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  iVar9 = -100;
  local_1e8.cstep = 0;
  local_1e8.data = (void *)0x0;
  local_1e8.refcount._0_4_ = 0;
  local_1e8.refcount._4_4_ = 0;
  local_1e8.elemsize._0_4_ = 0;
  local_1e8.elemsize._4_4_ = 0;
  local_1e8.elempack = 0;
  local_1e8.dims = 0;
  local_1e8.w = 0;
  local_1e8.h = 0;
  local_1e8.d = 0;
  local_1e8.c = 0;
LAB_00273ab7:
  piVar22 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar9;
}

Assistant:

int conv3x3s1_winograd23_int8_xop(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, int nT, const Option& opt)
{
    return conv3x3s1_winograd23_int8(bottom_blob, top_blob, AT, nT, opt);
}